

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::ColorQuant::addImage(ColorQuant *this,Image *img)

{
  int iVar1;
  int x;
  int iVar2;
  byte *in;
  uint8 *p;
  byte *in_00;
  uint8 rgba [4];
  RGBA local_3c;
  byte *local_38;
  
  in_00 = img->pixels;
  iVar1 = 0;
  do {
    if (img->height <= iVar1) {
      return;
    }
    local_38 = in_00;
    for (iVar2 = 0; iVar2 < img->width; iVar2 = iVar2 + 1) {
      switch(img->depth << 0x1e | img->depth - 4U >> 2) {
      case 0:
      case 1:
        in = img->palette + (ulong)*in_00 * 4;
        goto LAB_0010abb0;
      case 3:
        conv_RGBA8888_from_ARGB1555(&local_3c.red,in_00);
        break;
      case 5:
        conv_RGBA8888_from_RGB888(&local_3c.red,in_00);
        break;
      case 7:
        in = in_00;
LAB_0010abb0:
        conv_RGBA8888_from_RGBA8888(&local_3c.red,in);
      }
      addColor(this,local_3c);
      in_00 = in_00 + img->bpp;
    }
    in_00 = local_38 + img->stride;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void
ColorQuant::addImage(Image *img)
{
	RGBA col;
	uint8 rgba[4];
	uint8 *pixels = img->pixels;
	for(int y = 0; y < img->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < img->width; x++){
			uint8 *p = line;
			switch(img->depth){
			case 4: case 8:
				conv_RGBA8888_from_RGBA8888(rgba, &img->palette[p[0]*4]);
				break;
			case 32:
				conv_RGBA8888_from_RGBA8888(rgba, p);
				break;
			case 24:
				conv_RGBA8888_from_RGB888(rgba, p);
				break;
			case 16:
				conv_RGBA8888_from_ARGB1555(rgba, p);
				break;
			default: assert(0 && "invalid depth");
			}
			col.red = rgba[0];
			col.green = rgba[1];
			col.blue = rgba[2];
			col.alpha = rgba[3];
			this->addColor(col);
			line += img->bpp;
		}
		pixels += img->stride;
	}
}